

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int r1f3kb_(int *ido,int *l1,double *cc,int *in1,double *ch,int *in2,double *wa1,double *wa2)

{
  double *pdVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  double *pdVar23;
  int iVar24;
  ulong uVar25;
  double *pdVar26;
  int iVar27;
  double *pdVar28;
  double *pdVar29;
  double *pdVar30;
  double *pdVar31;
  long lVar32;
  double *pdVar33;
  double *pdVar34;
  int iVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  double *pdVar39;
  bool bVar40;
  double *local_f8;
  double *local_f0;
  double *local_a8;
  double *local_a0;
  ulong local_98;
  
  iVar2 = *in1;
  lVar32 = (long)iVar2;
  iVar5 = *ido;
  lVar13 = (long)iVar5;
  lVar8 = (long)(~(iVar5 * 4) * iVar2 + -1);
  lVar15 = (long)*in2;
  uVar3 = *l1;
  iVar9 = ~((uVar3 + 1) * iVar5) * *in2 + -1;
  uVar25 = 0;
  if (0 < (int)uVar3) {
    uVar25 = (ulong)uVar3;
  }
  iVar27 = iVar2 * iVar5 * 6;
  lVar19 = lVar13 * 6;
  lVar36 = (lVar19 + 1) * lVar32;
  lVar20 = lVar13 * lVar32;
  lVar38 = (lVar13 * 4 + 1) * lVar32;
  lVar6 = ((long)(int)uVar3 + 1) * lVar13;
  pdVar26 = ch + (lVar6 + 1) * lVar15 + 1;
  lVar21 = lVar13 * lVar15;
  lVar17 = ((long)(int)(uVar3 * 2) + 1) * lVar13;
  pdVar22 = ch + (lVar17 + 1) * lVar15 + 1;
  lVar10 = ((long)(int)(uVar3 * 3) + 1) * lVar13;
  pdVar11 = ch + (lVar10 + 1) * lVar15 + 1;
  pdVar1 = cc + lVar8 + 1;
  iVar4 = (int)uVar25;
  pdVar18 = pdVar1;
  while (bVar40 = uVar25 != 0, uVar25 = uVar25 - 1, bVar40) {
    pdVar26[iVar9] = pdVar1[iVar27] + pdVar1[iVar27] + pdVar18[lVar38];
    pdVar22[iVar9] =
         pdVar18[lVar36] * -1.7320508075688774 +
         pdVar1[iVar27] * -0.9999999999999996 + pdVar18[lVar38];
    pdVar11[iVar9] =
         pdVar18[lVar36] * 1.7320508075688774 +
         pdVar1[iVar27] * -0.9999999999999996 + pdVar18[lVar38];
    iVar27 = iVar27 + iVar2 * iVar5 * 3;
    pdVar18 = pdVar18 + lVar20 * 3;
    pdVar26 = pdVar26 + lVar21;
    pdVar22 = pdVar22 + lVar21;
    pdVar11 = pdVar11 + lVar21;
  }
  if (iVar5 != 1) {
    iVar24 = (iVar5 * 6 + -1) * iVar2;
    pdVar18 = cc + (lVar13 * 4 + 2) * lVar32 + 1;
    pdVar30 = cc + (lVar19 + 2) * lVar32 + 1;
    pdVar28 = ch + (lVar6 + 2) * lVar15 + 1;
    local_a0 = ch + (lVar17 + 2) * lVar15 + 1;
    pdVar22 = cc + (lVar13 * 4 + 3) * lVar32 + 1;
    pdVar33 = cc + (lVar19 + 3) * lVar32 + 1;
    pdVar26 = ch + (lVar10 + 2) * lVar15 + 1;
    pdVar37 = ch + (lVar6 + 3) * lVar15 + 1;
    local_a8 = ch + (lVar17 + 3) * lVar15 + 1;
    pdVar11 = ch + (lVar10 + 3) * lVar15 + 1;
    iVar27 = iVar2 * iVar5 * 3;
    iVar5 = (iVar5 * 6 + -2) * iVar2;
    for (local_98 = 1; local_98 != iVar4 + 1; local_98 = local_98 + 1) {
      pdVar7 = local_a8;
      pdVar12 = pdVar18;
      pdVar14 = local_a0;
      pdVar23 = pdVar22;
      pdVar29 = pdVar28;
      pdVar31 = pdVar30;
      pdVar34 = pdVar33;
      pdVar39 = pdVar37;
      iVar35 = iVar24;
      local_f8 = pdVar26;
      local_f0 = pdVar11;
      iVar16 = iVar5;
      for (lVar6 = 3; lVar6 <= lVar13; lVar6 = lVar6 + 2) {
        pdVar29[iVar9] = pdVar31[lVar8] + pdVar1[iVar16] + pdVar12[lVar8];
        pdVar39[iVar9] = (pdVar34[lVar8] - pdVar1[iVar35]) + pdVar23[lVar8];
        pdVar14[iVar9] =
             ((pdVar34[lVar8] + pdVar1[iVar35]) * -0.8660254037844387 +
             (pdVar31[lVar8] + pdVar1[iVar16]) * -0.4999999999999998 + pdVar12[lVar8]) *
             wa1[lVar6 + -3] -
             ((pdVar31[lVar8] - pdVar1[iVar16]) * 0.8660254037844387 +
             (pdVar34[lVar8] - pdVar1[iVar35]) * -0.4999999999999998 + pdVar23[lVar8]) *
             wa1[lVar6 + -2];
        pdVar7[iVar9] =
             ((pdVar31[lVar8] - pdVar1[iVar16]) * 0.8660254037844387 +
             (pdVar34[lVar8] - pdVar1[iVar35]) * -0.4999999999999998 + pdVar23[lVar8]) *
             wa1[lVar6 + -3] +
             ((pdVar34[lVar8] + pdVar1[iVar35]) * -0.8660254037844387 +
             (pdVar31[lVar8] + pdVar1[iVar16]) * -0.4999999999999998 + pdVar12[lVar8]) *
             wa1[lVar6 + -2];
        local_f8[iVar9] =
             ((pdVar34[lVar8] + pdVar1[iVar35]) * 0.8660254037844387 +
             (pdVar31[lVar8] + pdVar1[iVar16]) * -0.4999999999999998 + pdVar12[lVar8]) *
             wa2[lVar6 + -3] -
             ((pdVar31[lVar8] - pdVar1[iVar16]) * -0.8660254037844387 +
             (pdVar34[lVar8] - pdVar1[iVar35]) * -0.4999999999999998 + pdVar23[lVar8]) *
             wa2[lVar6 + -2];
        local_f0[iVar9] =
             ((pdVar31[lVar8] - pdVar1[iVar16]) * -0.8660254037844387 +
             (pdVar34[lVar8] - pdVar1[iVar35]) * -0.4999999999999998 + pdVar23[lVar8]) *
             wa2[lVar6 + -3] +
             ((pdVar34[lVar8] + pdVar1[iVar35]) * 0.8660254037844387 +
             (pdVar31[lVar8] + pdVar1[iVar16]) * -0.4999999999999998 + pdVar12[lVar8]) *
             wa2[lVar6 + -2];
        iVar35 = iVar35 + iVar2 * -2;
        iVar16 = iVar16 + iVar2 * -2;
        pdVar12 = pdVar12 + lVar32 * 2;
        pdVar31 = pdVar31 + lVar32 * 2;
        pdVar29 = pdVar29 + lVar15 * 2;
        pdVar14 = pdVar14 + lVar15 * 2;
        local_f8 = local_f8 + lVar15 * 2;
        pdVar23 = pdVar23 + lVar32 * 2;
        pdVar34 = pdVar34 + lVar32 * 2;
        pdVar39 = pdVar39 + lVar15 * 2;
        pdVar7 = pdVar7 + lVar15 * 2;
        local_f0 = local_f0 + lVar15 * 2;
      }
      iVar24 = iVar24 + iVar27;
      iVar5 = iVar5 + iVar27;
      pdVar18 = pdVar18 + lVar20 * 3;
      pdVar30 = pdVar30 + lVar20 * 3;
      pdVar28 = pdVar28 + lVar21;
      local_a0 = local_a0 + lVar21;
      pdVar26 = pdVar26 + lVar21;
      pdVar22 = pdVar22 + lVar20 * 3;
      pdVar33 = pdVar33 + lVar20 * 3;
      pdVar37 = pdVar37 + lVar21;
      local_a8 = local_a8 + lVar21;
      pdVar11 = pdVar11 + lVar21;
    }
  }
  return 0;
}

Assistant:

int r1f3kb_(int *ido, int *l1, fft_real_t *cc, int *
	in1, fft_real_t *ch, int *in2, fft_real_t *wa1, fft_real_t *wa2)
{
    /* System generated locals */
    int cc_dim1, cc_dim2, cc_offset, ch_dim1, ch_dim2, ch_dim3, ch_offset,
	     i__1, i__2;

    /* Builtin functions */

    /* Local variables */
     int i__, k, ic;
     fft_real_t arg;
     int idp2;
     fft_real_t taui, taur;


    /* Parameter adjustments */
    --wa2;
    --wa1;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_offset = 1 + cc_dim1 * (1 + (cc_dim2 << 2));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    arg = atan(1.0) * 8.0 / 3.0;
    taur = cos(arg);
    taui = sin(arg);
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ch[((k + ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 + 1) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[(*ido + (k * 3 + 2) *
		cc_dim2) * cc_dim1 + 1] * 2.0;
	ch[((k + (ch_dim3 << 1)) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 +
		1) * cc_dim2 + 1) * cc_dim1 + 1] + taur * 2.0 * cc[(*ido + (k
		* 3 + 2) * cc_dim2) * cc_dim1 + 1] - taui * 2.0 * cc[((k * 3
		+ 3) * cc_dim2 + 1) * cc_dim1 + 1];
	ch[((k + ch_dim3 * 3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 + 1)
		* cc_dim2 + 1) * cc_dim1 + 1] + taur * 2.0 * cc[(*ido + (k *
		3 + 2) * cc_dim2) * cc_dim1 + 1] + taui * 2.0 * cc[((k * 3 +
		3) * cc_dim2 + 1) * cc_dim1 + 1];
/* L101: */
    }
    if (*ido == 1) {
	return 0;
    }
    idp2 = *ido + 2;
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    ch[(i__ - 1 + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ -
		    1 + (k * 3 + 1) * cc_dim2) * cc_dim1 + 1] + (cc[(i__ - 1
		    + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k
		    * 3 + 2) * cc_dim2) * cc_dim1 + 1]);
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     3 + 1) * cc_dim2) * cc_dim1 + 1] + (cc[(i__ + (k * 3 + 3)
		     * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]);
	    ch[(i__ - 1 + (k + (ch_dim3 << 1)) * ch_dim2) * ch_dim1 + 1] =
		    wa1[i__ - 2] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1])) - wa1[i__ - 1] * (cc[(i__ + (k * 3 + 1)
		    * cc_dim2) * cc_dim1 + 1] + taur * (cc[(i__ + (k * 3 + 3)
		    * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ - 1 + (k * 3 +
		    3) * cc_dim2) * cc_dim1 + 1] - cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k + (ch_dim3 << 1)) * ch_dim2) * ch_dim1 + 1] = wa1[
		    i__ - 2] * (cc[(i__ + (k * 3 + 1) * cc_dim2) * cc_dim1 +
		    1] + taur * (cc[(i__ + (k * 3 + 3) * cc_dim2) * cc_dim1 +
		    1] - cc[(ic + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]) +
		    taui * (cc[(i__ - 1 + (k * 3 + 3) * cc_dim2) * cc_dim1 +
		    1] - cc[(ic - 1 + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]))
		    + wa1[i__ - 1] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1]));
	    ch[(i__ - 1 + (k + ch_dim3 * 3) * ch_dim2) * ch_dim1 + 1] = wa2[
		    i__ - 2] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1])) - wa2[i__ - 1] * (cc[(i__ + (k * 3 + 1)
		    * cc_dim2) * cc_dim1 + 1] + taur * (cc[(i__ + (k * 3 + 3)
		    * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ - 1 + (k * 3 +
		    3) * cc_dim2) * cc_dim1 + 1] - cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k + ch_dim3 * 3) * ch_dim2) * ch_dim1 + 1] = wa2[i__ -
		    2] * (cc[(i__ + (k * 3 + 1) * cc_dim2) * cc_dim1 + 1] +
		    taur * (cc[(i__ + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] -
		    cc[(ic + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]) - taui * (
		    cc[(i__ - 1 + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] - cc[(
		    ic - 1 + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1])) + wa2[
		    i__ - 1] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1]));
/* L102: */
	}
/* L103: */
    }
    return 0;
}